

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall van_kampen::Graph::printSelf(Graph *this,ostream *os,graphOutputFormat fmt)

{
  ulong uVar1;
  graphOutputFormat fmt_00;
  ostream *os_00;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  _Node_iterator_base<int,_false> local_60;
  key_type local_54;
  _Node_iterator_base<int,_false> local_50;
  ulong local_48;
  size_t i_1;
  key_type local_34;
  _Node_iterator_base<int,_false> local_30;
  ulong local_28;
  size_t i;
  ostream *poStack_18;
  graphOutputFormat fmt_local;
  ostream *os_local;
  Graph *this_local;
  
  i._4_4_ = fmt;
  poStack_18 = os;
  os_local = (ostream *)this;
  if (fmt == DOT) {
    std::operator<<(os,"digraph G {\nrankdir=LR;\nlayout=neato;\n");
  }
  else if (fmt == WOLFRAM_NOTEBOOK) {
    std::operator<<(os,"Graph[Rule @@@ {");
  }
  for (local_28 = 0; uVar1 = local_28,
      sVar3 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(&this->nodes_),
      uVar1 < sVar3; local_28 = local_28 + 1) {
    local_34 = (key_type)local_28;
    local_30._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                   (&this->removedNodes_,&local_34);
    i_1 = (size_t)std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  ::end(&this->removedNodes_);
    bVar2 = std::__detail::operator!=(&local_30,(_Node_iterator_base<int,_false> *)&i_1);
    if (!bVar2) {
      pvVar4 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::operator[]
                         (&this->nodes_,local_28);
      Node::printSelf(pvVar4,poStack_18,i._4_4_);
    }
  }
  for (local_48 = 0; uVar1 = local_48,
      sVar3 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(&this->nodes_),
      uVar1 < sVar3; local_48 = local_48 + 1) {
    local_54 = (key_type)local_48;
    local_50._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                   (&this->removedNodes_,&local_54);
    local_60._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                   (&this->removedNodes_);
    bVar2 = std::__detail::operator!=(&local_50,&local_60);
    if (!bVar2) {
      pvVar4 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::operator[]
                         (&this->nodes_,local_48);
      os_00 = poStack_18;
      fmt_00 = i._4_4_;
      uVar1 = local_48;
      sVar3 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(&this->nodes_);
      Node::printTransitions(pvVar4,os_00,fmt_00,uVar1 == sVar3 - 1);
    }
  }
  if (i._4_4_ == DOT) {
    std::operator<<(poStack_18,"}\n");
  }
  else if (i._4_4_ == WOLFRAM_NOTEBOOK) {
    std::operator<<(poStack_18,"}, GraphLayout -> \"PlanarEmbedding\"]\n");
  }
  std::ostream::flush();
  return;
}

Assistant:

void Graph::printSelf(std::ostream &os, graphOutputFormat fmt) const
{
    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "digraph G {\n"
              "rankdir=LR;\n"
              "layout=neato;\n";
        break;
    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "Graph[Rule @@@ {";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }

    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printSelf(os, fmt);
    }
    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printTransitions(os, fmt, i == nodes_.size() - 1);
    }

    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "}\n";
        break;

    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "}, GraphLayout -> \"PlanarEmbedding\"]\n";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }
    os.flush();
}